

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  cmake *pcVar3;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  undefined1 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  CURL_conflict *data;
  long lVar12;
  cmCTestScriptHandler *pcVar13;
  cmValue source;
  unsigned_long uVar14;
  FILE *__stream;
  string *psVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  string *h;
  pointer pbVar19;
  undefined8 uStackY_7c0;
  Curl_easy *in_stack_fffffffffffff848;
  cmCryptoHash hasher;
  allocator<char> local_779;
  cmCTestSubmitHandlerVectorOfChar chunk;
  allocator<char> local_751;
  curl_slist *local_750;
  string local_748;
  string local_file;
  bool local_708;
  cmCTestCurlOpts curlOpts;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  long response_code;
  string upload_as;
  string remote_file;
  string retryCount;
  ostringstream cmCTestLog_msg;
  undefined7 uStack_61f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_610 [22];
  _Vector_base<char,_std::allocator<char>_> local_4a8;
  _Vector_base<char,_std::allocator<char>_> local_490;
  string ofile;
  string local_458;
  char error_buffer [1024];
  
  local_750 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar1 = (this->HttpHeaders).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar19 = (this->HttpHeaders).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar19 != pbVar1; pbVar19 = pbVar19 + 1
      ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Add HTTP Header: \"");
    poVar11 = std::operator<<(poVar11,(string *)pbVar19);
    poVar11 = std::operator<<(poVar11,"\"");
    std::endl<char,std::char_traits<char>>(poVar11);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0xa9,local_file._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&local_file);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    local_750 = curl_slist_append(local_750,(pbVar19->_M_dataplus)._M_p);
  }
  curl_global_init(3);
  cmCTestCurlOpts::cmCTestCurlOpts(&curlOpts,(this->super_cmCTestGenericHandler).CTest);
  pbVar19 = (files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar19 == pbVar1) {
      curl_slist_free_all(local_750);
      curl_global_cleanup();
LAB_001f78fc:
      return pbVar19 == pbVar1;
    }
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      _cmCTestLog_msg = (pointer)local_610;
      local_610[0]._M_local_buf[0] = '\0';
      cmCurlSetCAInfo(&local_458,data,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (curlOpts.TLSVersionOpt.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged == true) {
        cmCurlPrintTLSVersion_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_file,
                   curlOpts.TLSVersionOpt.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload._M_value);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"  Set CURLOPT_SSLVERSION to ");
        if (local_708 == true) {
          std::__cxx11::string::string((string *)&remote_file,(string *)&local_file);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&remote_file,"unknown value",&local_751);
        }
        poVar11 = std::operator<<(poVar11,(string *)&remote_file);
        std::operator<<(poVar11,"\n");
        std::__cxx11::string::~string((string *)&remote_file);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xbc,remote_file._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&remote_file);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_setopt(data,CURLOPT_SSLVERSION,
                         (ulong)(uint)curlOpts.TLSVersionOpt.super__Optional_base<int,_true,_true>.
                                      _M_payload.super__Optional_payload_base<int>._M_payload.
                                      _M_value);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_file);
      }
      if (curlOpts.TLSVerifyOpt.super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"  Set CURLOPT_SSL_VERIFYPEER to ");
        pcVar17 = "off";
        if (curlOpts.TLSVerifyOpt.super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value != false) {
          pcVar17 = "on";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        std::operator<<(poVar11,"\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xc4,local_file._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&local_file);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,
                         (ulong)curlOpts.TLSVerifyOpt.super__Optional_base<bool,_true,_true>.
                                _M_payload.super__Optional_payload_base<bool>._M_payload._M_value);
      }
      if (curlOpts.VerifyHostOff == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"  Set CURLOPT_SSL_VERIFYHOST to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xcb,local_file._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&local_file);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        curl_easy_setopt(data,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
        if (this->HTTPProxyType == 3) {
          uStackY_7c0 = 5;
        }
        else {
          if (this->HTTPProxyType != 2) {
            curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
            if ((this->HTTPProxyAuth)._M_string_length != 0) {
              curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p);
            }
            goto LAB_001f670b;
          }
          uStackY_7c0 = 4;
        }
        curl_easy_setopt(data,CURLOPT_PROXYTYPE,uStackY_7c0);
      }
LAB_001f670b:
      bVar6 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar6) {
        curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(data,CURLOPT_UPLOAD,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
      uVar7 = GetSubmitInactivityTimeout(this);
      if (uVar7 != 0) {
        curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,(ulong)uVar7);
      }
      curl_easy_setopt(data,CURLOPT_VERBOSE,1);
      curl_easy_setopt(data,CURLOPT_HTTPHEADER,local_750);
      std::__cxx11::string::string((string *)&local_file,(string *)pbVar19);
      bVar6 = cmsys::SystemTools::FileExists(&local_file);
      if (!bVar6) {
        cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
                  ((string *)&cmCTestLog_msg,localprefix,(char (*) [2])0x7d3e91,pbVar19);
        std::__cxx11::string::operator=((string *)&local_file,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      }
      cmsys::SystemTools::GetFilenameName((string *)&cmCTestLog_msg,pbVar19);
      std::operator+(&remote_file,remoteprefix,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      poVar11 = std::operator<<(this->LogFile,"\tUpload file: ");
      poVar11 = std::operator<<(poVar11,(string *)&local_file);
      poVar11 = std::operator<<(poVar11," to ");
      poVar11 = std::operator<<(poVar11,(string *)&remote_file);
      std::endl<char,std::char_traits<char>>(poVar11);
      cmSystemTools::EncodeURL(&ofile,&remote_file,true);
      lVar12 = std::__cxx11::string::find((char)url,0x3f);
      uVar4 = 0x26;
      if (lVar12 == -1) {
        uVar4 = 0x3f;
      }
      cmCTestLog_msg = (ostringstream)uVar4;
      cmStrCat<std::__cxx11::string_const&,char,char_const(&)[10],std::__cxx11::string&>
                (&upload_as,url,(char *)&cmCTestLog_msg,(char (*) [10])"FileName=",&ofile);
      if (!bVar6) {
        cmCTestCurl::cmCTestCurl
                  ((cmCTestCurl *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::append((char *)&upload_as);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_748,"BuildName",(allocator<char> *)&chunk);
        cmCTest::GetCTestConfiguration(&retryCount,pcVar2,&local_748);
        cmCTestCurl::Escape((string *)&hasher,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&local_748);
        std::__cxx11::string::append((char *)&upload_as);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_748,"Site",(allocator<char> *)&chunk);
        cmCTest::GetCTestConfiguration(&retryCount,pcVar2,&local_748);
        cmCTestCurl::Escape((string *)&hasher,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&local_748);
        std::__cxx11::string::append((char *)&upload_as);
        cmCTest::GetCurrentTag_abi_cxx11_(&retryCount,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape((string *)&hasher,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::append((char *)&upload_as);
        cmCTest::GetTestModelString_abi_cxx11_
                  (&retryCount,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape((string *)&hasher,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::string::~string((string *)&retryCount);
        pcVar13 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        pcVar3 = (pcVar13->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
                 _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
        if (pcVar3 != (cmake *)0x0) {
          this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (pcVar3->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hasher,"SubProject",(allocator<char> *)&retryCount);
          source = cmState::GetGlobalProperty
                             ((cmState *)
                              this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                              _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                              super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&hasher
                             );
          std::__cxx11::string::~string((string *)&hasher);
          if (source.Value != (string *)0x0) {
            std::__cxx11::string::append((char *)&upload_as);
            cmCTestCurl::Escape((string *)&hasher,(cmCTestCurl *)&cmCTestLog_msg,source.Value);
            std::__cxx11::string::append((string *)&upload_as);
            std::__cxx11::string::~string((string *)&hasher);
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)&cmCTestLog_msg);
      }
      bVar6 = std::operator==(pbVar19,"Done.xml");
      if (bVar6) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      std::__cxx11::string::append((char *)&upload_as);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,"InternalTest",(allocator<char> *)&retryCount);
      hasher._0_8_ = cmCTestGenericHandler::GetOption
                               (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
      bVar6 = cmValue::IsOn((cmValue *)&hasher);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (bVar6) {
        std::__cxx11::string::append((char *)&upload_as);
      }
      else {
        cmCryptoHash::cmCryptoHash(&hasher,AlgoMD5);
        cmCryptoHash::HashFile((string *)&cmCTestLog_msg,&hasher,&local_file);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        cmCryptoHash::~cmCryptoHash(&hasher);
      }
      bVar6 = cmsys::SystemTools::FileExists(&local_file);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Cannot find file: ");
        poVar11 = std::operator<<(poVar11,(string *)&local_file);
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x135,(char *)hasher._0_8_,false);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_cleanup(in_stack_fffffffffffff848);
        curl_slist_free_all(local_750);
        curl_global_cleanup();
        std::__cxx11::string::~string((string *)&upload_as);
        std::__cxx11::string::~string((string *)&ofile);
        std::__cxx11::string::~string((string *)&remote_file);
        std::__cxx11::string::~string((string *)&local_file);
        goto LAB_001f78fc;
      }
      uVar14 = cmsys::SystemTools::FileLength(&local_file);
      __stream = (FILE *)cmsys::SystemTools::Fopen(&local_file,"rb");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Upload file: ");
      poVar11 = std::operator<<(poVar11,(string *)&local_file);
      poVar11 = std::operator<<(poVar11," to ");
      poVar11 = std::operator<<(poVar11,(string *)&upload_as);
      poVar11 = std::operator<<(poVar11," Size: ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x142,(char *)hasher._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&hasher);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      curl_easy_setopt(data,CURLOPT_URL,upload_as._M_dataplus._M_p);
      curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
      curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
      curl_easy_setopt(data,CURLOPT_READDATA,__stream);
      curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar14);
      curl_easy_setopt(data,CURLOPT_ERRORBUFFER,error_buffer);
      curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
      curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      curl_easy_setopt(data,CURLOPT_WRITEDATA,&chunk);
      curl_easy_setopt(data,CURLOPT_DEBUGDATA,&chunkDebug);
      curl_easy_perform(data);
      if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
        hasher.CTX = (rhash_context *)
                     (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                     -(long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
        hasher._0_8_ = chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&hasher);
        poVar11 = std::operator<<(poVar11,"]");
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x16b,(char *)hasher._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_490,&chunk);
        ParseResponse(this,(cmCTestSubmitHandlerVectorOfChar *)&local_490);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_490);
      }
      if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL debug output: [");
        hasher.CTX = (rhash_context *)
                     (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                     -(long)chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
        hasher._0_8_ = chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&hasher);
        poVar11 = std::operator<<(poVar11,"]");
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x174,(char *)hasher._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      curl_easy_getinfo(data,CURLINFO_RESPONSE_CODE,&response_code);
      bVar6 = response_code == 200;
      if ((!bVar6) || (bVar5 = true, this->HasErrors == true)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,"RetryDelay",(allocator<char> *)&retryCount);
        psVar15 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
        if (psVar15 == (string *)0x0) {
          psVar15 = &cmValue::Empty_abi_cxx11_;
        }
        std::__cxx11::string::string((string *)&hasher,(string *)psVar15);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,"RetryCount",(allocator<char> *)&local_748);
        psVar15 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
        if (psVar15 == (string *)0x0) {
          psVar15 = &cmValue::Empty_abi_cxx11_;
        }
        std::__cxx11::string::string((string *)&retryCount,(string *)psVar15);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (hasher.CTX == (rhash_context *)0x0) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_748,"CTestSubmitRetryDelay",&local_779);
          cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar2,&local_748);
          iVar8 = atoi(_cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_748);
        }
        else {
          iVar8 = atoi((char *)hasher._0_8_);
        }
        if (retryCount._M_string_length == 0) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_748,"CTestSubmitRetryCount",&local_779);
          cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar2,&local_748);
          iVar9 = atoi(_cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_748);
        }
        else {
          iVar9 = atoi(retryCount._M_dataplus._M_p);
        }
        iVar18 = 0;
        iVar10 = 0;
        if (0 < iVar9) {
          iVar10 = iVar9;
        }
        do {
          bVar5 = bVar6;
          if (iVar18 == iVar10) goto LAB_001f746e;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::operator<<((ostream *)&cmCTestLog_msg,"   Submit failed, waiting ");
          poVar11 = std::ostream::_M_insert<double>((double)iVar8);
          std::operator<<(poVar11," seconds...\n");
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,399,local_748._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_748);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          lVar12 = std::chrono::_V2::steady_clock::now();
          while (lVar16 = std::chrono::_V2::steady_clock::now(),
                (double)lVar16 < (double)lVar12 + (double)iVar8 * 1000000000.0) {
            cmsys::SystemTools::Delay(100);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Retry submission: Attempt ");
          iVar18 = iVar18 + 1;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar18);
          poVar11 = std::operator<<(poVar11," of ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar9);
          std::endl<char,std::char_traits<char>>(poVar11);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x199,local_748._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_748);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          fclose(__stream);
          __stream = (FILE *)cmsys::SystemTools::Fopen(&local_file,"rb");
          curl_easy_setopt(data,CURLOPT_READDATA,__stream);
          if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start) {
            chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          this->HasErrors = false;
          curl_easy_perform(data);
          if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start !=
              chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
            local_748._M_string_length =
                 (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_748._M_dataplus._M_p =
                 chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&local_748);
            poVar11 = std::operator<<(poVar11,"]");
            std::endl<char,std::char_traits<char>>(poVar11);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1aa,local_748._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            std::__cxx11::string::~string((string *)&local_748);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&local_4a8,&chunk);
            ParseResponse(this,(cmCTestSubmitHandlerVectorOfChar *)&local_4a8);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_4a8);
          }
          curl_easy_getinfo(data,CURLINFO_RESPONSE_CODE,&response_code);
        } while ((response_code != 200) || (this->HasErrors != false));
        bVar5 = true;
LAB_001f746e:
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&hasher);
      }
      fclose(__stream);
      if (bVar5) {
        curl_easy_cleanup(in_stack_fffffffffffff848);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hasher,
                       "   Uploaded: ",&local_file);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&hasher);
        std::endl<char,std::char_traits<char>>(poVar11);
        std::__cxx11::string::~string((string *)&hasher);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1d4,(char *)hasher._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Error when uploading file: ");
        poVar11 = std::operator<<(poVar11,(string *)&local_file);
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1ba,(char *)hasher._0_8_,false);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Error message was: ");
        poVar11 = std::operator<<(poVar11,error_buffer);
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1bc,(char *)hasher._0_8_,false);
        std::__cxx11::string::~string((string *)&hasher);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<(this->LogFile,"   Error when uploading file: ");
        poVar11 = std::operator<<(poVar11,(string *)&local_file);
        poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<(poVar11,"   Error message was: ");
        poVar11 = std::operator<<(poVar11,error_buffer);
        std::endl<char,std::char_traits<char>>(poVar11);
        if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          poVar11 = std::operator<<(this->LogFile,"   Curl output was: ");
          _cmCTestLog_msg =
               chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start;
          poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&cmCTestLog_msg);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
          hasher.CTX = (rhash_context *)
                       (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                       -(long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
          hasher._0_8_ = chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&hasher);
          poVar11 = std::operator<<(poVar11,"]");
          std::endl<char,std::char_traits<char>>(poVar11);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1c9,(char *)hasher._0_8_,false);
          std::__cxx11::string::~string((string *)&hasher);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        }
        curl_easy_cleanup(in_stack_fffffffffffff848);
        curl_slist_free_all(local_750);
        curl_global_cleanup();
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&chunk.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&upload_as);
      std::__cxx11::string::~string((string *)&ofile);
      std::__cxx11::string::~string((string *)&remote_file);
      std::__cxx11::string::~string((string *)&local_file);
      if (!bVar5) goto LAB_001f78fc;
    }
    pbVar19 = pbVar19 + 1;
  } while( true );
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  cmCTestCurlOpts curlOpts(this->CTest);
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (curlOpts.TLSVersionOpt) {
        cm::optional<std::string> tlsVersionStr =
          cmCurlPrintTLSVersion(*curlOpts.TLSVersionOpt);
        cmCTestOptionalLog(
          this->CTest, HANDLER_VERBOSE_OUTPUT,
          "  Set CURLOPT_SSLVERSION to "
            << (tlsVersionStr ? *tlsVersionStr : "unknown value") << "\n",
          this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSLVERSION, *curlOpts.TLSVersionOpt);
      }
      if (curlOpts.TLSVerifyOpt) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to "
                             << (*curlOpts.TLSVerifyOpt ? "on" : "off")
                             << "\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER,
                         *curlOpts.TLSVerifyOpt ? 1 : 0);
      }
      if (curlOpts.VerifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
      if (submitInactivityTimeout != 0) {
        ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                           submitInactivityTimeout);
      }

      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = cmStrCat(localprefix, "/", file);
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as =
        cmStrCat(url, ((url.find('?') == std::string::npos) ? '?' : '&'),
                 "FileName=", ofile);

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(*subproject);
          }
        }
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      upload_as += "&MD5=";

      if (this->GetOption("InternalTest").IsOn()) {
        upload_as += "ffffffffffffffffffffffffffffffff";
      } else {
        cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
        upload_as += hasher.HashFile(local_file);
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // follow redirects
      ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1);

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      long response_code;
      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
      bool successful_submission = response_code == 200;

      if (!successful_submission || this->HasErrors) {
        std::string retryDelay = *this->GetOption("RetryDelay");
        std::string retryCount = *this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
          if (response_code == 200 && !this->HasErrors) {
            successful_submission = true;
            break;
          }
        }
      }

      fclose(ftpfile);
      if (!successful_submission) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}